

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  ImGuiID node_id;
  ImGuiID node_id_00;
  bool bVar1;
  char **ppcVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindowSettings *pIVar4;
  uint *puVar5;
  ImGuiDockNode *pIVar6;
  ImGuiWindow **ppIVar7;
  ImGuiWindow *window;
  int window_n;
  ImGuiDockNode *node;
  ImGuiID dst_dock_id_1;
  ImGuiID src_dock_id_1;
  int dock_remap_n_1;
  int dock_remap_n;
  ImGuiID dst_dock_id;
  ImGuiWindowSettings *src_window_settings;
  ImGuiWindow *src_window;
  ImGuiID src_dock_id;
  ImGuiID src_window_id;
  char *dst_window_name;
  char *src_window_name;
  undefined1 local_48 [4];
  int remap_window_n;
  ImVector<unsigned_int> src_windows;
  undefined1 local_28 [8];
  ImVector<unsigned_int> node_remap_pairs;
  ImVector<const_char_*> *in_window_remap_pairs_local;
  ImGuiID dst_dockspace_id_local;
  ImGuiID src_dockspace_id_local;
  
  node_remap_pairs.Data = (uint *)in_window_remap_pairs;
  if (src_dockspace_id == 0) {
    __assert_fail("src_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x416c,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (dst_dockspace_id == 0) {
    __assert_fail("dst_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x416d,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (in_window_remap_pairs == (ImVector<const_char_*> *)0x0) {
    __assert_fail("in_window_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x416e,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (*(int *)in_window_remap_pairs % 2 != 0) {
    __assert_fail("(in_window_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x416f,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)local_28);
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,(ImVector<unsigned_int> *)local_28);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)local_48);
  src_window_name._4_4_ = 0;
  do {
    if ((int)*node_remap_pairs.Data <= src_window_name._4_4_) {
      for (dst_dock_id_1 = 0; (int)dst_dock_id_1 < (int)local_28._0_4_;
          dst_dock_id_1 = dst_dock_id_1 + 2) {
        puVar5 = ImVector<unsigned_int>::operator[]
                           ((ImVector<unsigned_int> *)local_28,dst_dock_id_1);
        node_id = *puVar5;
        if (node_id != 0) {
          puVar5 = ImVector<unsigned_int>::operator[]
                             ((ImVector<unsigned_int> *)local_28,dst_dock_id_1 + 1);
          node_id_00 = *puVar5;
          pIVar6 = DockBuilderGetNode(node_id);
          for (window._4_4_ = 0; window._4_4_ < (pIVar6->Windows).Size;
              window._4_4_ = window._4_4_ + 1) {
            ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&pIVar6->Windows,window._4_4_);
            pIVar3 = *ppIVar7;
            bVar1 = ImVector<unsigned_int>::contains((ImVector<unsigned_int> *)local_48,&pIVar3->ID)
            ;
            if (!bVar1) {
              DockBuilderDockWindow(pIVar3->Name,node_id_00);
            }
          }
        }
      }
      ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)local_48);
      ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)local_28);
      return;
    }
    ppcVar2 = ImVector<const_char_*>::operator[]
                        ((ImVector<const_char_*> *)node_remap_pairs.Data,src_window_name._4_4_);
    dst_window_name = *ppcVar2;
    ppcVar2 = ImVector<const_char_*>::operator[]
                        ((ImVector<const_char_*> *)node_remap_pairs.Data,src_window_name._4_4_ + 1);
    _src_dock_id = *ppcVar2;
    src_window._4_4_ = ImHashStr(dst_window_name,0,0);
    ImVector<unsigned_int>::push_back
              ((ImVector<unsigned_int> *)local_48,(uint *)((long)&src_window + 4));
    src_window._0_4_ = 0;
    pIVar3 = FindWindowByID(src_window._4_4_);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      pIVar4 = FindWindowSettings(src_window._4_4_);
      if (pIVar4 != (ImGuiWindowSettings *)0x0) {
        src_window._0_4_ = pIVar4->DockId;
      }
    }
    else {
      src_window._0_4_ = pIVar3->DockId;
    }
    dock_remap_n_1 = 0;
    for (src_dock_id_1 = 0; (int)src_dock_id_1 < (int)local_28._0_4_;
        src_dock_id_1 = src_dock_id_1 + 2) {
      puVar5 = ImVector<unsigned_int>::operator[]((ImVector<unsigned_int> *)local_28,src_dock_id_1);
      if (*puVar5 == (ImGuiID)src_window) {
        puVar5 = ImVector<unsigned_int>::operator[]
                           ((ImVector<unsigned_int> *)local_28,src_dock_id_1 + 1);
        dock_remap_n_1 = *puVar5;
        break;
      }
    }
    if (dock_remap_n_1 == 0) {
      DockBuilderCopyWindowSettings(dst_window_name,_src_dock_id);
    }
    else {
      DockBuilderDockWindow(_src_dock_id,dock_remap_n_1);
    }
    src_window_name._4_4_ = src_window_name._4_4_ + 2;
  } while( true );
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}